

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::checkFramebufferStatus(Functions *gl)

{
  NotSupportedError *this;
  TestError *this_00;
  string sStack_68;
  string local_48;
  code *local_28;
  GLenum local_20;
  
  local_20 = (*gl->checkFramebufferStatus)(0x8d40);
  if (local_20 == 0x8cd5) {
    return;
  }
  if (local_20 == 0x8cdd) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_68,"Unsupported framebuffer configuration",
               (allocator<char> *)&local_48);
    tcu::NotSupportedError::NotSupportedError(this,&sStack_68);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_28 = glu::getFramebufferStatusName;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_48,&local_28);
  std::operator+(&sStack_68,"Incomplete framebuffer: ",&local_48);
  tcu::TestError::TestError(this_00,&sStack_68);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void checkFramebufferStatus (const glw::Functions& gl)
{
	const deUint32 status = gl.checkFramebufferStatus(GL_FRAMEBUFFER);

	if (status == GL_FRAMEBUFFER_UNSUPPORTED)
		throw tcu::NotSupportedError("Unsupported framebuffer configuration");
	else if (status != GL_FRAMEBUFFER_COMPLETE)
		throw tcu::TestError("Incomplete framebuffer: " + glu::getFramebufferStatusStr(status).toString());
}